

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> * __thiscall
Cipher::Processor::getClusterings
          (vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *__return_storage_ptr__,
          Processor *this,int nClusterings)

{
  double dVar1;
  pointer piVar2;
  pointer pTVar3;
  pointer pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  TSimilarityMap *pTVar10;
  pointer pvVar11;
  int iVar12;
  TClusters *__x;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  __normal_iterator<Cipher::TResult_*,_std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>_>
  __i;
  pointer pTVar18;
  ulong uVar19;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> *result;
  TClusters clustersNew;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> all;
  int local_b4;
  double local_a8;
  vector<int,_std::allocator<int>_> local_90;
  ulong local_78;
  double local_70;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> local_68;
  double local_50;
  value_type *local_48;
  double local_40;
  double local_38;
  
  __x = &(this->m_curResult).clusters;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__x);
  uVar19 = (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = &this->m_curResult;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (&local_68,&this->m_curResult);
  local_a8 = (double)(this->m_params).temp0;
  local_50 = (double)(this->m_params).coolingRate;
  uVar13 = (uint)(uVar19 >> 2);
  local_70 = (double)(int)((uVar13 - 1) * uVar13) * 0.5;
  local_78 = 0;
  local_b4 = 0;
  do {
    std::vector<int,_std::allocator<int>_>::operator=(&local_90,__x);
    iVar6 = rand();
    iVar14 = (int)((long)iVar6 % (long)(int)uVar13);
    iVar12 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar14];
    do {
      iVar7 = rand();
      iVar7 = iVar7 % ((this->m_params).maxClusters + -1) + 1;
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar14] = iVar7;
    } while (iVar7 == iVar12);
    dVar1 = this->m_pCur;
    local_38 = local_70 * dVar1;
    if (0 < (int)uVar13) {
      piVar2 = (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = 0;
      uVar19 = 0;
      do {
        if (((long)iVar6 % (long)(int)uVar13 & 0xffffffffU) != uVar19) {
          pTVar10 = &this->m_logMapInv;
          if (piVar2[uVar19] == piVar2[iVar14]) {
            pTVar10 = &this->m_logMap;
          }
          pvVar11 = (this->m_logMapInv).
                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar19] == iVar7) {
            pvVar11 = (this->m_logMap).
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          local_38 = (local_38 -
                     *(double *)
                      (*(long *)&(pTVar10->
                                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar14].
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                 super__Vector_impl_data + lVar15)) +
                     *(double *)
                      (*(long *)&pvVar11[iVar14].
                                 super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                 super__Vector_impl_data + lVar15);
        }
        uVar19 = uVar19 + 1;
        lVar15 = lVar15 + 0x10;
      } while ((uVar13 & 0x7fffffff) != uVar19);
    }
    local_38 = local_38 / local_70;
    if (dVar1 <= local_38) {
      std::vector<int,_std::allocator<int>_>::operator=(__x,&local_90);
LAB_0014595e:
      (this->m_curResult).pClusters = local_38;
      this->m_pCur = local_38;
    }
    else {
      local_40 = exp((local_38 - dVar1) / local_a8);
      fVar20 = frand();
      if ((double)fVar20 < local_40) {
        std::vector<int,_std::allocator<int>_>::operator=(__x,&local_90);
        goto LAB_0014595e;
      }
    }
    if (this->m_pCur <
        local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].pClusters ||
        this->m_pCur ==
        local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].pClusters) {
      local_b4 = local_b4 + 1;
    }
    else {
      local_b4 = 0;
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back(&local_68,local_48);
    }
    uVar8 = (int)local_78 + 1;
    local_78 = (ulong)uVar8;
    if (((uVar8 * 0x26e978d5 >> 3 | uVar8 * -0x60000000) < 0x418938) &&
       (local_a8 = local_a8 * local_50, local_a8 < 1e-06)) {
      local_a8 = 1e-06;
    }
  } while ((local_b4 < 0x3e9) || (2e-06 <= local_a8));
  dVar1 = local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].pClusters;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
            (__return_storage_ptr__,
             local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  if (1 < nClusterings) {
    iVar12 = 1;
    do {
      lVar15 = (long)local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      iVar14 = (int)lVar15 * -0x45d1745d;
      iVar6 = (int)((ulong)(lVar15 * -0x1745d1745d1745d1) / 6);
      if (iVar6 < iVar14) {
        pTVar3 = (__return_storage_ptr__->
                 super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = (int)((long)(__return_storage_ptr__->
                             super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                 -0x45d1745d;
        uVar9 = (ulong)iVar6;
        uVar19 = 0xffffffff;
        uVar21 = 0;
        uVar22 = 0xbff00000;
        do {
          if (dVar1 * 1.1 <=
              local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>._M_impl
              .super__Vector_impl_data._M_start[uVar9].pClusters) {
            dVar23 = 1.79769313486232e+308;
            if (0 < (int)uVar13) {
              uVar16 = (ulong)(uVar13 & 0x7fffffff);
              pdVar17 = &pTVar3->pClusters;
              dVar24 = 1.79769313486232e+308;
              do {
                dVar23 = ABS(local_68.
                             super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9].pClusters - *pdVar17);
                if (dVar24 <= dVar23) {
                  dVar23 = dVar24;
                }
                pdVar17 = pdVar17 + 0xb;
                uVar16 = uVar16 - 1;
                dVar24 = dVar23;
              } while (uVar16 != 0);
            }
            if ((double)CONCAT44(uVar22,uVar21) <= dVar23 &&
                dVar23 != (double)CONCAT44(uVar22,uVar21)) {
              uVar19 = uVar9 & 0xffffffff;
            }
            if (dVar23 <= (double)CONCAT44(uVar22,uVar21)) {
              dVar23 = (double)CONCAT44(uVar22,uVar21);
            }
            uVar21 = SUB84(dVar23,0);
            uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
          }
          iVar6 = (int)uVar19;
          uVar9 = uVar9 + 1;
        } while (uVar9 != (long)iVar14);
        bVar5 = 0.005 < (double)CONCAT44(uVar22,uVar21) || (double)CONCAT44(uVar22,uVar21) == 0.005;
      }
      else {
        iVar6 = -1;
        bVar5 = false;
      }
      if ((!bVar5) || (iVar6 == -1)) break;
      std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::push_back
                (__return_storage_ptr__,
                 local_68.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar6);
      iVar12 = iVar12 + 1;
    } while (iVar12 != nClusterings);
  }
  pTVar3 = (__return_storage_ptr__->
           super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (__return_storage_ptr__->
           super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar4) {
    uVar19 = ((long)pTVar4 - (long)pTVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar15 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
              (pTVar3,pTVar4,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar4 - (long)pTVar3 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar3,pTVar4);
    }
    else {
      pTVar18 = pTVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                (pTVar3,pTVar18);
      for (; pTVar18 != pTVar4; pTVar18 = pTVar18 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Cipher::TResult*,std::vector<Cipher::TResult,std::allocator<Cipher::TResult>>>,__gnu_cxx::__ops::_Val_comp_iter<Cipher::Processor::getClusterings(int)::__0>>
                  (pTVar18);
      }
    }
  }
  std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(&local_68);
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TResult> Processor::getClusterings(int nClusterings) {
        const auto p0 = m_curResult.pClusters;
        //printf("    [getClusterings] p0 = %g\n", p0);

        int nNoImprovement = 0;
        int nTotalIterations = 0;
        auto clustersNew = m_curResult.clusters;
        const int n = clustersNew.size();

        std::vector<TResult> all;
        all.push_back(m_curResult);

        // simulated annealing
        double T = m_params.temp0;
        const double TMin = 0.000001;
        const double alpha = m_params.coolingRate;
        const double pScale = ((n*(n-1))/2.0);

        while (true) {
            clustersNew = m_curResult.clusters;

            // mutate
            int idxChanged = -1;
            {
                idxChanged = rand()%n;

                auto old = clustersNew[idxChanged];
                do {
                    clustersNew[idxChanged] = 1 + rand()%(m_params.maxClusters - 1);
                } while (clustersNew[idxChanged] == old);
            }

            // compute pNew
            auto pNew = m_pCur*pScale;
            {
                const int j = idxChanged;
                for (int i = 0; i < n; ++i) {
                    if (i == j) {
                        continue;
                    }

                    if (m_curResult.clusters[i] == m_curResult.clusters[j]) {
                        pNew -= m_logMap[j][i].cc;
                    } else {
                        pNew -= m_logMapInv[j][i].cc;
                    }

                    if (clustersNew[i] == clustersNew[j]) {
                        pNew += m_logMap[j][i].cc;
                    } else {
                        pNew += m_logMapInv[j][i].cc;
                    }
                }

                pNew /= pScale;
            }

            // check if we should accept the new value
            if (pNew >= m_pCur) {
                m_curResult.clusters = clustersNew;
                m_curResult.pClusters = pNew;
                m_pCur = pNew;
            } else {
                // accept with probability
                const auto pAccept = std::exp((pNew - m_pCur)/T);
                if (pAccept > frand()) {
                    //printf("    [getClusterings] N = %5d, T = %8.8f, pNew = %g, pCur = %g, pAccept = %g\n", nNoImprovement, T, pNew, m_pCur, pAccept);
                    m_curResult.clusters = clustersNew;
                    m_curResult.pClusters = pNew;
                    m_pCur = pNew;
                }
            }

            // check if we should stop
            if (m_pCur > all.back().pClusters) {
                all.push_back(m_curResult);
                nNoImprovement = 0;
            } else {
                nNoImprovement += 1;
            }

            // update temperature
            nTotalIterations++;
            if (nTotalIterations % 1000 == 0) {
                T = T * alpha;
                if (T < TMin) {
                    T = TMin;
                }
                //printf("    [getClusterings] T = %g\n", T);
            }

            if (nNoImprovement > 1000 && T < 2*TMin) {
                break;
            }
        }

        //printf("    [getClusterings] nTotalIterations = %d\n", nTotalIterations);
        //printf("    [getClusterings] pFinal = %g\n", m_curResult.pClusters);

        const auto pClustersBest = all.back().pClusters;

        std::vector<TResult> result;
        {
            result.push_back(all.back());

            for (int i = 1; i < nClusterings; ++i) {
                int jBest = -1;
                double pDiffMax = -1.0;
                for (int j = 5*all.size()/6; j < (int) all.size(); ++j) {
                    if (all[j].pClusters < 1.1*pClustersBest) {
                        continue;
                    }
                    double pDiffMin = std::numeric_limits<double>::max();
                    for (int k = 0; k < (int) result.size(); ++k) {
                        double pDiff = std::fabs(all[j].pClusters - result[k].pClusters);
                        if (pDiffMin > pDiff) {
                            pDiffMin = pDiff;
                        }
                    }
                    if (pDiffMax < pDiffMin) {
                        pDiffMax = pDiffMin;
                        jBest = j;
                    }
                }

                if (pDiffMax < 0.005 || jBest == -1) {
                    break;
                }

                result.push_back(all[jBest]);
            }
        }

        std::sort(result.begin(), result.end(), [](const TResult & a, const TResult & b) {
            return a.pClusters > b.pClusters;
        });

        return result;
    }